

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

int float_down(long hmask,long emask)

{
  char *pcVar1;
  boolean bVar2;
  int n;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  char *local_38;
  bool local_2f;
  boolean local_2b;
  d_level local_2a;
  boolean sokoban_trap;
  boolean no_msg;
  trap *ptStack_28;
  d_level current_dungeon_level;
  trap *trap;
  long emask_local;
  long hmask_local;
  
  ptStack_28 = (trap *)0x0;
  local_2b = '\0';
  u.uprops[0x12].intrinsic = u.uprops[0x12].intrinsic & ((uint)hmask ^ 0xffffffff);
  u.uprops[0x12].extrinsic = u.uprops[0x12].extrinsic & ((uint)emask ^ 0xffffffff);
  if (((u.uprops[0x12].intrinsic != 0) || (u.uprops[0x12].extrinsic != 0)) ||
     ((youmonst.data)->mlet == '\x05')) {
    return 0;
  }
  if ((u._1052_1_ & 1) != 0) {
    bVar5 = true;
    if (((u.uprops[0x3c].extrinsic == 0) && (bVar5 = true, ((youmonst.data)->mflags1 & 1) == 0)) &&
       (bVar5 = false, u.usteed != (monst *)0x0)) {
      bVar5 = ((u.usteed)->data->mflags1 & 1) != 0;
    }
    pcVar4 = "You float down, but you are still %s.";
    if (bVar5) {
      pcVar4 = "You feel less buoyant, but you are still %s.";
    }
    pcVar1 = "while engulfed";
    if (((u.ustuck)->data->mflags1 & 0x40000) != 0) {
      pcVar1 = "while swallowed";
    }
    pline(pcVar4,pcVar1 + 6);
    return 1;
  }
  if (((uball != (obj *)0x0) && (uball->where != '\x03')) &&
     ((bVar2 = is_pool(level,(int)uball->ox,(int)uball->oy), bVar2 != '\0' ||
      ((ptStack_28 = t_at(level,(int)uball->ox,(int)uball->oy), ptStack_28 != (trap *)0x0 &&
       (((((ptStack_28->field_0x8 & 0x1f) == 0xb || ((ptStack_28->field_0x8 & 0x1f) == 0xc)) ||
         ((ptStack_28->field_0x8 & 0x1f) == 0xe)) || ((ptStack_28->field_0x8 & 0x1f) == 0xd))))))))
  {
    u.ux0 = u.ux;
    u.uy0 = u.uy;
    u.ux = uball->ox;
    u.uy = uball->oy;
    movobj(uchain,uball->ox,uball->oy);
    newsym((int)u.ux0,(int)u.uy0);
    vision_full_recalc = '\x01';
  }
  if (((u.uprops[0x3c].extrinsic == 0) && (((youmonst.data)->mflags1 & 1) == 0)) &&
     ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)))) {
    if (((u._1052_1_ & 1) == 0) && (u.ustuck != (monst *)0x0)) {
      bVar2 = sticks(youmonst.data);
      if (bVar2 == '\0') {
        pcVar4 = mon_nam(u.ustuck);
        pline("Startled, %s can no longer hold you!",pcVar4);
      }
      else {
        pcVar4 = mon_nam(u.ustuck);
        pline("You aren\'t able to maintain your hold on %s.",pcVar4);
      }
      u.ustuck = (monst *)0x0;
      u._1052_1_ = u._1052_1_ & 0x7f;
    }
    bVar2 = is_pool(level,(int)u.ux,(int)u.uy);
    if (((bVar2 != '\0') &&
        ((((u.uprops[0x27].extrinsic == 0 ||
           (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 != '\0')) &&
          (u.uprops[0x39].intrinsic == 0)) &&
         ((u.uprops[0x39].extrinsic == 0 && (((youmonst.data)->mflags1 & 2) == 0)))))) &&
       (((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 2) == 0)) &&
        (((byte)u._1052_1_ >> 1 & 1) == 0)))) {
      local_2b = drown();
    }
    bVar2 = is_lava(level,(int)u.ux,(int)u.uy);
    if (bVar2 != '\0') {
      lava_effects();
      local_2b = '\x01';
    }
    bVar2 = is_swamp(level,(int)u.ux,(int)u.uy);
    if (bVar2 != '\0') {
      swamp_effects();
      local_2b = '\x01';
    }
  }
  if (ptStack_28 == (trap *)0x0) {
    ptStack_28 = t_at(level,(int)u.ux,(int)u.uy);
    bVar2 = on_level(&u.uz,&dungeon_topology.d_air_level);
    if (bVar2 == '\0') {
      bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
      if ((bVar2 == '\0') || (local_2b != '\0')) {
        if ((((byte)u._1052_1_ >> 1 & 1) == 0) && ((local_2b == '\0' && ((emask & 0x100000U) == 0)))
           ) {
          bVar5 = u.uz.dnum == dungeon_topology.d_sokoban_dnum;
          bVar6 = ptStack_28 != (trap *)0x0;
          local_2f = bVar5 && bVar6;
          if ((u.uprops[0x23].intrinsic == 0) ||
             ((u.uprops[0x24].extrinsic != 0 ||
              ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0'))))))
          {
            if (local_2f) {
              pline("You fall over.");
              n = rnd(2);
              losehp(n,"dangerous winds",1);
              if (u.usteed != (monst *)0x0) {
                dismount_steed(1);
              }
              selftouch("As you fall, you");
            }
            else if (((u.uprops[0x3c].extrinsic == 0) && (((youmonst.data)->mflags1 & 1) == 0)) &&
                    ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)))) {
              pcVar4 = surface((int)u.ux,(int)u.uy);
              pline("You float gently to the %s.",pcVar4);
            }
            else {
              pline("You feel less buoyant.");
            }
          }
          else {
            bVar2 = is_pool(level,(int)u.ux,(int)u.uy);
            if (bVar2 == '\0') {
              local_38 = "hit the ground";
              if (bVar5 && bVar6) {
                local_38 = "crashed";
              }
            }
            else {
              local_38 = "splashed down";
            }
            pline("Bummer!  You\'ve %s.",local_38);
          }
        }
      }
      else {
        pline("You feel heavier.");
      }
    }
    else if (((u.uprops[0x3c].extrinsic == 0) && (((youmonst.data)->mflags1 & 1) == 0)) &&
            ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)))) {
      pline("You begin to tumble in place.");
    }
    else {
      pline("You feel less buoyant.");
    }
    nomul(0,(char *)0x0);
  }
  assign_level(&local_2a,&u.uz);
  if (ptStack_28 != (trap *)0x0) {
    uVar3 = (byte)ptStack_28->field_0x8 & 0x1f;
    if (uVar3 - 0xd < 2) {
      bVar2 = can_fall_thru(level);
      if ((bVar2 == '\0') || (u.ustuck != (monst *)0x0)) goto LAB_003107d1;
    }
    else if (uVar3 == 0x14) goto LAB_003107d1;
    if (u.utrap == 0) {
      dotrap(ptStack_28,0);
    }
  }
LAB_003107d1:
  bVar2 = on_level(&u.uz,&dungeon_topology.d_air_level);
  if ((((bVar2 == '\0') && (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 == '\0'))
      && ((u._1052_1_ & 1) == 0)) && (bVar2 = on_level(&u.uz,&local_2a), bVar2 != '\0')) {
    pickup(1);
  }
  return 1;
}

Assistant:

int float_down(long hmask, long emask)     /* might cancel timeout */
{
	struct trap *trap = NULL;
	d_level current_dungeon_level;
	boolean no_msg = FALSE;

	HLevitation &= ~hmask;
	ELevitation &= ~emask;
	if (Levitation) return 0; /* maybe another ring/potion/boots */
	if (u.uswallow) {
	    pline((Flying) ? "You feel less buoyant, but you are still %s." :
	                     "You float down, but you are still %s.",
		is_animal(u.ustuck->data) ? "swallowed" : "engulfed");
	    return 1;
	}

	if (Punished && !carried(uball) &&
	    (is_pool(level, uball->ox, uball->oy) ||
	     ((trap = t_at(level, uball->ox, uball->oy)) &&
	      ((trap->ttyp == PIT) || (trap->ttyp == SPIKED_PIT) ||
	       (trap->ttyp == TRAPDOOR) || (trap->ttyp == HOLE))))) {
			u.ux0 = u.ux;
			u.uy0 = u.uy;
			u.ux = uball->ox;
			u.uy = uball->oy;
			movobj(uchain, uball->ox, uball->oy);
			newsym(u.ux0, u.uy0);
			vision_full_recalc = 1;	/* in case the hero moved. */
	}
	/* check for falling into pool - added by GAN 10/20/86 */
	if (!Flying) {
		if (!u.uswallow && u.ustuck) {
			if (sticks(youmonst.data))
				pline("You aren't able to maintain your hold on %s.",
					mon_nam(u.ustuck));
			else
				pline("Startled, %s can no longer hold you!",
					mon_nam(u.ustuck));
			u.ustuck = 0;
			u.uwilldrown = 0;
		}
		/* kludge alert:
		 * drown() and lava_effects() print various messages almost
		 * every time they're called which conflict with the "fall
		 * into" message below.  Thus, we want to avoid printing
		 * confusing, duplicate or out-of-order messages.
		 * Use knowledge of the two routines as a hack -- this
		 * should really be handled differently -dlc
		 */
		if (is_pool(level, u.ux,u.uy) && !Wwalking && !Swimming && !u.uinwater)
			no_msg = drown();
		if (is_lava(level, u.ux,u.uy)) {
			lava_effects();
			no_msg = TRUE;
		}
		if (is_swamp(level, u.ux,u.uy)) {
			swamp_effects();
			no_msg = TRUE;
		}
	}
	if (!trap) {
	    trap = t_at(level, u.ux,u.uy);
	    if (Is_airlevel(&u.uz)) {
		if (Flying)
		    pline("You feel less buoyant.");
		else
		    pline("You begin to tumble in place.");
	    } else if (Is_waterlevel(&u.uz) && !no_msg)
		pline("You feel heavier.");
	    /* u.uinwater msgs already in spoteffects()/drown() */
	    else if (!u.uinwater && !no_msg) {
		if (!(emask & W_SADDLE))
		{
		    boolean sokoban_trap = (In_sokoban(&u.uz) && trap);
		    if (Hallucination)
			pline("Bummer!  You've %s.",
			      is_pool(level, u.ux,u.uy) ?
			      "splashed down" : sokoban_trap ? "crashed" :
			      "hit the ground");
		    else {
			if (!sokoban_trap) {
			    if (Flying)
				pline("You feel less buoyant.");
			    else
				pline("You float gently to the %s.",
				      surface(u.ux, u.uy));
			} else {
			    /* Justification elsewhere for Sokoban traps
			     * is based on air currents. This is
			     * consistent with that.
			     * The unexpected additional force of the
			     * air currents once leviation
			     * ceases knocks you off your feet.
			     */
			    pline("You fall over.");
			    losehp(rnd(2), "dangerous winds", KILLED_BY);
			    if (u.usteed) dismount_steed(DISMOUNT_FELL);
			    selftouch("As you fall, you");
			}
		    }
		}
	    }
	    nomul(0, NULL);
	}

	/* can't rely on u.uz0 for detecting trap door-induced level change;
	   it gets changed to reflect the new level before we can check it */
	assign_level(&current_dungeon_level, &u.uz);

	if (trap)
		switch(trap->ttyp) {
		case STATUE_TRAP:
			break;
		case HOLE:
		case TRAPDOOR:
			if (!can_fall_thru(level) || u.ustuck)
				break;
			/* fall into next case */
		default:
			if (!u.utrap) /* not already in the trap */
				dotrap(trap, 0);
	}

	if (!Is_airlevel(&u.uz) && !Is_waterlevel(&u.uz) && !u.uswallow &&
		/* falling through trap door calls goto_level,
		   and goto_level does its own pickup() call */
		on_level(&u.uz, &current_dungeon_level))
	    pickup(1);
	return 1;
}